

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

Iterator *
testing::internal::
CheckedDowncastToActualType<testing::internal::ValuesInIteratorRangeGenerator<libaom_test::FuncParam<unsigned_int(*)(unsigned_char_const*,int,int_const*,int_const*)>>::Iterator_const,testing::internal::ParamIteratorInterface<libaom_test::FuncParam<unsigned_int(*)(unsigned_char_const*,int,int_const*,int_const*)>>const>
          (ParamIteratorInterface<libaom_test::FuncParam<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>_>
           *base)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  Iterator *pIVar3;
  undefined8 uVar4;
  GTestLog local_c;
  
  if (base != (ParamIteratorInterface<libaom_test::FuncParam<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>_>
               *)0x0) {
    __s1 = *(char **)(base->_vptr_ParamIteratorInterface[-1] + 8);
    if (__s1 == 
        "N7testing8internal30ValuesInIteratorRangeGeneratorIN11libaom_test9FuncParamIPFjPKhiPKiS7_EEEE8IteratorE"
       ) {
      bVar1 = true;
    }
    else if (*__s1 == '*') {
      bVar1 = false;
    }
    else {
      iVar2 = strcmp(__s1,
                     "N7testing8internal30ValuesInIteratorRangeGeneratorIN11libaom_test9FuncParamIPFjPKhiPKiS7_EEEE8IteratorE"
                    );
      bVar1 = iVar2 == 0;
    }
    bVar1 = IsTrue(bVar1);
    if (!bVar1) {
      GTestLog::GTestLog(&local_c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-port.h"
                         ,0x45e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",0x33);
      GTestLog::~GTestLog(&local_c);
    }
    pIVar3 = (Iterator *)
             __dynamic_cast(base,&ParamIteratorInterface<libaom_test::FuncParam<unsigned_int(*)(unsigned_char_const*,int,int_const*,int_const*)>>
                                  ::typeinfo,
                            &ValuesInIteratorRangeGenerator<libaom_test::FuncParam<unsigned_int(*)(unsigned_char_const*,int,int_const*,int_const*)>>
                             ::Iterator::typeinfo,0);
    return pIVar3;
  }
  uVar4 = __cxa_bad_typeid();
  GTestLog::~GTestLog(&local_c);
  _Unwind_Resume(uVar4);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}